

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool Fossilize::merge_concurrent_databases
               (char *append_archive,char **source_paths,size_t num_source_paths,
               bool skip_missing_inputs)

{
  char *path;
  int iVar1;
  DatabaseInterface *pDVar2;
  size_t sVar3;
  undefined7 in_register_00000009;
  bool bVar4;
  pointer puVar5;
  uint uVar6;
  allocator_type local_9d;
  undefined4 local_9c;
  DatabaseInterface *local_98;
  size_t blob_size;
  size_t hash_count;
  size_t local_80;
  char **local_78;
  size_t local_70;
  pointer local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> blob;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  
  bVar4 = false;
  local_98 = create_stream_archive_database(append_archive,Append);
  iVar1 = (*local_98->_vptr_DatabaseInterface[2])();
  if ((char)iVar1 != '\0') {
    local_9c = (undefined4)CONCAT71(in_register_00000009,skip_missing_inputs);
    sVar3 = 0;
    local_78 = source_paths;
    while (sVar3 != num_source_paths) {
      path = local_78[sVar3];
      local_70 = sVar3;
      pDVar2 = create_stream_archive_database(path,ReadOnly);
      iVar1 = (*pDVar2->_vptr_DatabaseInterface[2])(pDVar2);
      if ((char)iVar1 == '\0') {
        if ((char)local_9c == '\0') {
LAB_0013ea68:
          (*pDVar2->_vptr_DatabaseInterface[1])(pDVar2);
          bVar4 = false;
          goto LAB_0013ea73;
        }
        fprintf(_stderr,"Fossilize WARN: Archive %s could not be prepared, skipping.\n",path);
      }
      else {
        local_80 = num_source_paths;
        for (uVar6 = 0; num_source_paths = local_80, uVar6 != 10; uVar6 = uVar6 + 1) {
          hash_count = 0;
          iVar1 = (*pDVar2->_vptr_DatabaseInterface[6])(pDVar2,(ulong)uVar6,&hash_count,0);
          if ((char)iVar1 == '\0') goto LAB_0013ea68;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&hashes,hash_count,(allocator_type *)&blob);
          iVar1 = (*pDVar2->_vptr_DatabaseInterface[6])(pDVar2,(ulong)uVar6,&hash_count);
          if ((char)iVar1 == '\0') {
LAB_0013ea5e:
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      (&hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
            goto LAB_0013ea68;
          }
          local_68 = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          puVar5 = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          while (puVar5 != local_68) {
            blob_size = 0;
            iVar1 = (*pDVar2->_vptr_DatabaseInterface[3])
                              (pDVar2,(ulong)uVar6,*puVar5,&blob_size,0,1);
            if ((char)iVar1 == '\0') goto LAB_0013ea5e;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                       blob_size,&local_9d);
            iVar1 = (*pDVar2->_vptr_DatabaseInterface[3])
                              (pDVar2,(ulong)uVar6,*puVar5,&blob_size,
                               blob.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,1);
            if ((char)iVar1 == '\0') {
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        (&blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
              goto LAB_0013ea5e;
            }
            iVar1 = (*local_98->_vptr_DatabaseInterface[4])
                              (local_98,(ulong)uVar6,*puVar5,
                               blob.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)blob.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)blob.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,1);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            puVar5 = puVar5 + 1;
            if ((char)iVar1 == '\0') goto LAB_0013ea5e;
          }
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        }
      }
      (*pDVar2->_vptr_DatabaseInterface[1])(pDVar2);
      sVar3 = local_70 + 1;
    }
    bVar4 = true;
  }
LAB_0013ea73:
  (*local_98->_vptr_DatabaseInterface[1])();
  return bVar4;
}

Assistant:

bool merge_concurrent_databases(const char *append_archive, const char * const *source_paths, size_t num_source_paths,
                                bool skip_missing_inputs)
{
	auto append_db = std::unique_ptr<DatabaseInterface>(create_stream_archive_database(append_archive, DatabaseMode::Append));
	if (!append_db->prepare())
		return false;

	for (size_t source = 0; source < num_source_paths; source++)
	{
		const char *path = source_paths[source];
		auto source_db = std::unique_ptr<DatabaseInterface>(create_stream_archive_database(path, DatabaseMode::ReadOnly));
		if (!source_db->prepare())
		{
			if (!skip_missing_inputs)
				return false;

			LOGW("Archive %s could not be prepared, skipping.\n", path);
			continue;
		}

		for (unsigned i = 0; i < RESOURCE_COUNT; i++)
		{
			auto tag = static_cast<ResourceTag>(i);

			size_t hash_count = 0;
			if (!source_db->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
				return false;
			std::vector<Hash> hashes(hash_count);
			if (!source_db->get_hash_list_for_resource_tag(tag, &hash_count, hashes.data()))
				return false;

			for (auto &hash : hashes)
			{
				size_t blob_size = 0;
				if (!source_db->read_entry(tag, hash, &blob_size, nullptr, PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
					return false;
				std::vector<uint8_t> blob(blob_size);
				if (!source_db->read_entry(tag, hash, &blob_size, blob.data(), PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
					return false;

				if (!append_db->write_entry(tag, hash, blob.data(), blob.size(), PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT))
					return false;
			}
		}
	}

	return true;
}